

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *this_00;
  _Base_ptr p_Var1;
  _Elt_pointer pUVar2;
  pointer pcVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  bool bVar5;
  BOM BVar6;
  const_iterator cVar7;
  iterator iVar8;
  iterator iVar9;
  undefined8 *puVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  char *pcVar13;
  ostream *poVar14;
  _Base_ptr p_Var15;
  char *path;
  char *path_00;
  _Rb_tree_header *p_Var16;
  string *dir_00;
  value_type *__x;
  string tempPathStr;
  string fullName;
  string obj_i;
  string obj_m;
  string dir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string binDir;
  int local_38c;
  string local_388;
  key_type local_368;
  key_type local_348;
  long *local_328;
  long local_320;
  long local_318 [2];
  RegularExpression *local_308;
  ostream *local_300;
  ostream *local_2f8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2f0;
  cmDependsC *local_2e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2e0;
  undefined1 local_2d8 [32];
  _Base_ptr local_2b8;
  size_t local_2b0;
  string *local_2a8;
  _Base_ptr local_2a0;
  _Base_ptr local_298;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
  *local_290;
  string local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined1 local_238 [32];
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [29];
  
  local_300 = makeDepends;
  local_2f8 = internalDepends;
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    pcVar13 = "Cannot scan dependencies without a source file.";
  }
  else {
    if (obj->_M_string_length != 0) {
      local_268._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_268._M_impl.super__Rb_tree_header._M_header;
      local_268._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_268._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_268._M_impl.super__Rb_tree_header._M_header._M_right =
           local_268._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((&this->ValidDeps->_M_t ==
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
            *)0x0) ||
         (cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                  ::find(&this->ValidDeps->_M_t,obj),
         (_Rb_tree_header *)cVar7._M_node == &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header)
         ) {
        local_38c = (int)(sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        local_2f0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)&this->Encountered;
        local_2e8 = this;
        local_2a8 = obj;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2f0);
        p_Var15 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var16 = &(sources->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var15 != p_Var16) {
          local_308 = (RegularExpression *)&local_2e8->Unscanned;
          do {
            local_238._8_8_ = 0;
            local_238[0x10] = '\0';
            local_218._M_p = (pointer)local_208;
            local_210 = 0;
            local_208[0]._M_local_buf[0] = '\0';
            local_238._0_8_ =
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_238 + 0x10);
            std::__cxx11::string::_M_assign((string *)local_238);
            std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
            push_back((deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                       *)local_308,(value_type *)local_238);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var15 + 1));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_p != local_208) {
              operator_delete(local_218._M_p,
                              CONCAT71(local_208[0]._M_allocated_capacity._1_7_,
                                       local_208[0]._M_local_buf[0]) + 1);
            }
            if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238._0_8_ !=
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_238 + 0x10)) {
              operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1
                             );
            }
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          } while ((_Rb_tree_header *)p_Var15 != p_Var16);
        }
        local_2d8._24_8_ = local_2d8 + 8;
        local_2d8._8_4_ = _S_red;
        local_2d8._16_8_ = (_Base_ptr)0x0;
        local_2b0 = 0;
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        local_388._M_string_length = 0;
        local_388.field_2._M_local_buf[0] = '\0';
        local_2b8 = (_Base_ptr)local_2d8._24_8_;
        std::__cxx11::string::reserve((ulong)&local_388);
        this = local_2e8;
        this_00 = &local_2e8->Unscanned;
        local_2e0 = &local_2e8->HeaderLocationCache;
        local_2a0 = &(local_2e8->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_308 = &local_2e8->IncludeRegexComplain;
        local_290 = &local_2e8->FileCache;
        local_298 = &(local_2e8->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        psVar4 = &local_2e8->Encountered;
        do {
          pUVar2 = (this->Unscanned).c.
                   super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          if ((this->Unscanned).c.
              super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar2) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              operator_delete(local_388._M_dataplus._M_p,
                              CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                       local_388.field_2._M_local_buf[0]) + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2d8);
            obj = local_2a8;
            goto LAB_0050768d;
          }
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          pcVar3 = (pUVar2->FileName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_348,pcVar3,pcVar3 + (pUVar2->FileName)._M_string_length);
          local_328 = local_318;
          pcVar3 = (pUVar2->QuotedLocation)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,pcVar3,pcVar3 + (pUVar2->QuotedLocation)._M_string_length)
          ;
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          pop_front(&this_00->c);
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          local_368._M_string_length = 0;
          local_368.field_2._M_local_buf[0] = '\0';
          if ((0 < local_38c) ||
             (bVar5 = cmsys::SystemTools::FileIsFullPath(local_348._M_dataplus._M_p), bVar5)) {
            bVar5 = cmsys::SystemTools::FileExists(local_348._M_dataplus._M_p,true);
            if (bVar5) goto LAB_00507334;
          }
          else if ((local_320 == 0) ||
                  (bVar5 = cmsys::SystemTools::FileExists((char *)local_328,true), !bVar5)) {
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&local_2e0->_M_t,&local_348);
            if (iVar11._M_node == local_2a0) {
              for (dir_00 = (this->super_cmDepends).IncludePath.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  dir_00 != (this->super_cmDepends).IncludePath.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; dir_00 = dir_00 + 1) {
                cmSystemTools::CollapseCombinedPath((string *)local_238,dir_00,&local_348);
                std::__cxx11::string::operator=((string *)&local_388,(string *)local_238);
                if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_238._0_8_ !=
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_238 + 0x10)) {
                  operator_delete((void *)local_238._0_8_,
                                  CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
                }
                bVar5 = cmsys::SystemTools::FileExists(local_388._M_dataplus._M_p,true);
                if (bVar5) {
                  std::__cxx11::string::_M_assign((string *)&local_368);
                  pmVar12 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](local_2e0,&local_348);
                  std::__cxx11::string::_M_assign((string *)pmVar12);
                  break;
                }
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_368);
            }
          }
          else {
LAB_00507334:
            std::__cxx11::string::_M_assign((string *)&local_368);
          }
          if ((local_368._M_string_length == 0) &&
             (bVar5 = cmsys::RegularExpression::find(local_308,local_348._M_dataplus._M_p), bVar5))
          {
            bVar5 = false;
            cmSystemTools::Error("Cannot find file \"",local_348._M_dataplus._M_p,"\".",(char *)0x0)
            ;
          }
          else {
            if ((local_368._M_string_length != 0) &&
               (iVar8 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2d8,&local_368), iVar8._M_node == (_Base_ptr)(local_2d8 + 8)
               )) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_2d8,&local_368);
              iVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
                      ::find(&local_290->_M_t,&local_368);
              if (iVar9._M_node == local_298) {
                std::ifstream::ifstream(local_238,local_368._M_dataplus._M_p,_S_in);
                if (((*(byte *)((long)&(*(_Base_ptr *)(local_238._0_8_ + -0x18))->_M_color +
                               (long)&local_218._M_p) & 5) == 0) &&
                   (BVar6 = cmsys::FStream::ReadBOM((istream *)local_238), BVar6 < BOM_UTF16BE)) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_268,&local_368);
                  cmsys::SystemTools::GetFilenamePath(&local_288,&local_368);
                  Scan(this,(istream *)local_238,local_288._M_dataplus._M_p,&local_368);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_288._M_dataplus._M_p != &local_288.field_2) {
                    operator_delete(local_288._M_dataplus._M_p,
                                    local_288.field_2._M_allocated_capacity + 1);
                  }
                }
                std::ifstream::~ifstream(local_238);
              }
              else {
                *(undefined1 *)(*(long *)(iVar9._M_node + 2) + 0x18) = 1;
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_268,&local_368);
                puVar10 = *(undefined8 **)(iVar9._M_node + 2);
                for (__x = (value_type *)*puVar10; __x != (value_type *)puVar10[1]; __x = __x + 1) {
                  iVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_2f0,&__x->FileName);
                  if ((_Rb_tree_header *)iVar8._M_node ==
                      &(psVar4->_M_t)._M_impl.super__Rb_tree_header) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>(local_2f0,&__x->FileName);
                    std::
                    deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                    push_back(&this_00->c,__x);
                  }
                  puVar10 = *(undefined8 **)(iVar9._M_node + 2);
                }
              }
            }
            local_38c = local_38c + -1;
            bVar5 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,
                            CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                                     local_368.field_2._M_local_buf[0]) + 1);
          }
          if (local_328 != local_318) {
            operator_delete(local_328,local_318[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
        } while (bVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,
                          CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                   local_388.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2d8);
        bVar5 = false;
      }
      else {
        p_Var15 = *(_Base_ptr *)(cVar7._M_node + 2);
        p_Var1 = cVar7._M_node[2]._M_parent;
        local_238._0_8_ = &local_268;
        if (p_Var15 != p_Var1) {
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_268,(const_iterator)&local_268._M_impl.super__Rb_tree_header,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var15,
                       (_Alloc_node *)local_238);
            p_Var15 = p_Var15 + 1;
          } while (p_Var15 != p_Var1);
        }
LAB_0050768d:
        pcVar13 = cmLocalGenerator::GetBinaryDirectory((this->super_cmDepends).LocalGenerator);
        std::__cxx11::string::string((string *)local_238,pcVar13,(allocator *)&local_348);
        cmOutputConverter::ConvertToRelativePath
                  (&local_348,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                   (string *)local_238,obj);
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  ((string *)local_2d8,(cmSystemTools *)local_348._M_dataplus._M_p,path);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_2f8,local_348._M_dataplus._M_p,local_348._M_string_length);
        std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        if ((_Rb_tree_header *)local_268._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_268._M_impl.super__Rb_tree_header) {
          p_Var15 = local_268._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_300,(char *)local_2d8._0_8_,
                                 CONCAT44(local_2d8._12_4_,local_2d8._8_4_));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
            cmOutputConverter::ConvertToRelativePath
                      (&local_368,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter
                       ,(string *)local_238,(string *)(p_Var15 + 1));
            cmSystemTools::ConvertToOutputPath_abi_cxx11_
                      (&local_388,(cmSystemTools *)local_368._M_dataplus._M_p,path_00);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,local_388._M_dataplus._M_p,local_388._M_string_length);
            std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              operator_delete(local_388._M_dataplus._M_p,
                              CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                       local_388.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              operator_delete(local_368._M_dataplus._M_p,
                              CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                                       local_368.field_2._M_local_buf[0]) + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_2f8," ",1);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_2f8,*(char **)(p_Var15 + 1),(long)p_Var15[1]._M_parent);
            std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          } while ((_Rb_tree_header *)p_Var15 != &local_268._M_impl.super__Rb_tree_header);
        }
        std::ios::widen((char)local_300->_vptr_basic_ostream[-3] + (char)local_300);
        std::ostream::put((char)local_300);
        std::ostream::flush();
        if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238._0_8_ !=
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
        }
        bVar5 = true;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_268);
      return bVar5;
    }
    pcVar13 = "Cannot scan dependencies without an object file.";
  }
  cmSystemTools::Error(pcVar13,(char *)0x0,(char *)0x0,(char *)0x0);
  return false;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  if (this->ValidDeps != CM_NULLPTR) {
    std::map<std::string, DependencyVector>::const_iterator tmpIt =
      this->ValidDeps->find(obj);
    if (tmpIt != this->ValidDeps->end()) {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
    }
  }

  if (!haveDeps) {
    // Walk the dependency graph starting with the source file.
    int srcFiles = (int)sources.size();
    this->Encountered.clear();

    for (std::set<std::string>::const_iterator srcIt = sources.begin();
         srcIt != sources.end(); ++srcIt) {
      UnscannedEntry root;
      root.FileName = *srcIt;
      this->Unscanned.push(root);
      this->Encountered.insert(*srcIt);
    }

    std::set<std::string> scanned;

    // Use reserve to allocate enough memory for tempPathStr
    // so that during the loops no memory is allocated or freed
    std::string tempPathStr;
    tempPathStr.reserve(4 * 1024);

    while (!this->Unscanned.empty()) {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if ((srcFiles > 0) ||
          cmSystemTools::FileIsFullPath(current.FileName.c_str())) {
        if (cmSystemTools::FileExists(current.FileName.c_str(), true)) {
          fullName = current.FileName;
        }
      } else if (!current.QuotedLocation.empty() &&
                 cmSystemTools::FileExists(current.QuotedLocation.c_str(),
                                           true)) {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
      } else {
        std::map<std::string, std::string>::iterator headerLocationIt =
          this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt != this->HeaderLocationCache.end()) {
          fullName = headerLocationIt->second;
        } else {
          for (std::vector<std::string>::const_iterator i =
                 this->IncludePath.begin();
               i != this->IncludePath.end(); ++i) {
            // Construct the name of the file as if it were in the current
            // include directory.  Avoid using a leading "./".

            tempPathStr =
              cmSystemTools::CollapseCombinedPath(*i, current.FileName);

            // Look for the file in this location.
            if (cmSystemTools::FileExists(tempPathStr.c_str(), true)) {
              fullName = tempPathStr;
              HeaderLocationCache[current.FileName] = fullName;
              break;
            }
          }
        }
      }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if (fullName.empty() &&
          this->IncludeRegexComplain.find(current.FileName.c_str())) {
        cmSystemTools::Error("Cannot find file \"", current.FileName.c_str(),
                             "\".");
        return false;
      }

      // Scan the file if it was found and has not been scanned already.
      if (!fullName.empty() && (scanned.find(fullName) == scanned.end())) {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        std::map<std::string, cmIncludeLines*>::iterator fileIt =
          this->FileCache.find(fullName);
        if (fileIt != this->FileCache.end()) {
          fileIt->second->Used = true;
          dependencies.insert(fullName);
          for (std::vector<UnscannedEntry>::const_iterator incIt =
                 fileIt->second->UnscannedEntries.begin();
               incIt != fileIt->second->UnscannedEntries.end(); ++incIt) {
            if (this->Encountered.find(incIt->FileName) ==
                this->Encountered.end()) {
              this->Encountered.insert(incIt->FileName);
              this->Unscanned.push(*incIt);
            }
          }
        } else {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if (fin) {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if (bom == cmsys::FStream::BOM_None ||
                bom == cmsys::FStream::BOM_UTF8) {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir.c_str(), fullName);
            } else {
              // Skip file with encoding we do not implement.
            }
          }
        }
      }

      srcFiles--;
    }
  }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->LocalGenerator->ConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i.c_str());
  internalDepends << obj_i << std::endl;

  for (std::set<std::string>::const_iterator i = dependencies.begin();
       i != dependencies.end(); ++i) {
    makeDepends
      << obj_m << ": "
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->ConvertToRelativePath(binDir, *i).c_str())
      << std::endl;
    internalDepends << " " << *i << std::endl;
  }
  makeDepends << std::endl;

  return true;
}